

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

hash_code llvm::detail::hash_value(IEEEFloat *Arg)

{
  fltSemantics *pfVar1;
  bool bVar2;
  uint uVar3;
  ExponentType *args_3;
  integerPart *first;
  integerPart *piVar4;
  byte local_29;
  hash_code local_28;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  IEEEFloat *local_18;
  IEEEFloat *Arg_local;
  
  local_18 = Arg;
  bVar2 = IEEEFloat::isFiniteNonZero(Arg);
  if (bVar2) {
    local_1b = local_18->field_0x12 & 7;
    local_1c = (byte)local_18->field_0x12 >> 3 & 1;
    pfVar1 = local_18->semantics;
    args_3 = &local_18->exponent;
    first = IEEEFloat::significandParts(local_18);
    piVar4 = IEEEFloat::significandParts(local_18);
    uVar3 = IEEEFloat::partCount(local_18);
    local_28 = hash_combine_range<unsigned_long_const*>(first,piVar4 + uVar3);
    Arg_local = (IEEEFloat *)
                hash_combine<unsigned_char,unsigned_char,unsigned_int,short,llvm::hash_code>
                          (&local_1b,&local_1c,&pfVar1->precision,args_3,&local_28);
  }
  else {
    local_19 = local_18->field_0x12 & 7;
    bVar2 = IEEEFloat::isNaN(local_18);
    if (bVar2) {
      local_29 = 0;
    }
    else {
      local_29 = (byte)local_18->field_0x12 >> 3 & 1;
    }
    local_1a = local_29;
    Arg_local = (IEEEFloat *)
                hash_combine<unsigned_char,unsigned_char,unsigned_int>
                          (&local_19,&local_1a,&local_18->semantics->precision);
  }
  return (hash_code)(size_t)Arg_local;
}

Assistant:

hash_code hash_value(const IEEEFloat &Arg) {
  if (!Arg.isFiniteNonZero())
    return hash_combine((uint8_t)Arg.category,
                        // NaN has no sign, fix it at zero.
                        Arg.isNaN() ? (uint8_t)0 : (uint8_t)Arg.sign,
                        Arg.semantics->precision);

  // Normal floats need their exponent and significand hashed.
  return hash_combine((uint8_t)Arg.category, (uint8_t)Arg.sign,
                      Arg.semantics->precision, Arg.exponent,
                      hash_combine_range(
                        Arg.significandParts(),
                        Arg.significandParts() + Arg.partCount()));
}